

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

int BuiltinCallLineSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int val;
  int local_4c;
  int u;
  int i;
  int v [5];
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  v[3] = numret;
  unique0x10000212 = ret;
  if (numparam < 3 || 7 < numparam) {
    __assert_fail("numparam > 2 && numparam < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1dd9,
                  "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type == '\0') {
    if (param[1].field_0.field_3.Type != '\x03') {
      __assert_fail("param[1].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1ddb,
                    "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    memset(&u,0,0x14);
    for (local_4c = 2; local_4c < numparam; local_4c = local_4c + 1) {
      (&u)[local_4c + -2] = param[local_4c].field_0.i;
    }
    val = P_ExecuteSpecial((param->field_0).i,(line_t *)0x0,(AActor *)param[1].field_0.field_1.a,
                           false,u,i,v[0],v[1],v[2]);
    if (v[3] < 1) {
      param_local._4_4_ = 0;
    }
    else {
      if (stack0xffffffffffffffd0 == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1de2,
                      "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetInt(stack0xffffffffffffffd0,val);
      param_local._4_4_ = 1;
    }
    return param_local._4_4_;
  }
  __assert_fail("param[0].Type == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1dda,
                "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

int BuiltinCallLineSpecial(VMValue *param, TArray<VMValue> &defaultparam, int numparam, VMReturn *ret, int numret)
{
	assert(numparam > 2 && numparam < 8);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	int v[5] = { 0 };

	for (int i = 2; i < numparam; ++i)
	{
		v[i - 2] = param[i].i;
	}
	ACTION_RETURN_INT(P_ExecuteSpecial(param[0].i, nullptr, reinterpret_cast<AActor*>(param[1].a), false, v[0], v[1], v[2], v[3], v[4]));
}